

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::socks5_alert::message_abi_cxx11_(string *__return_storage_ptr__,socks5_alert *this)

{
  error_category *peVar1;
  long *plVar2;
  size_t sVar3;
  endpoint *ep;
  char *pcVar4;
  char buf [512];
  long *local_268 [2];
  long local_258 [2];
  string local_248;
  char local_228 [520];
  
  if ((ulong)this->op < 0x2b) {
    pcVar4 = operation_name::names[this->op];
  }
  else {
    pcVar4 = "unknown operation";
  }
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(local_268,peVar1,(ulong)(uint)(this->error).val_);
  plVar2 = local_268[0];
  print_endpoint_abi_cxx11_(&local_248,(libtorrent *)&this->ip,ep);
  snprintf(local_228,0x200,"SOCKS5 error. op: %s ec: %s ep: %s",pcVar4,plVar2,
           local_248._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar3 = strlen(local_228);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228,local_228 + sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string socks5_alert::message() const
	{
		char buf[512];
		std::snprintf(buf, sizeof(buf), "SOCKS5 error. op: %s ec: %s ep: %s"
			, operation_name(op), error.message().c_str(), print_endpoint(ip).c_str());
		return buf;
	}